

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  TString *pTVar1;
  ravi_type_map rVar2;
  LocVar *pLVar3;
  ulong uVar4;
  uint uVar5;
  Upvaldesc *pUVar6;
  BlockCnt *pBVar7;
  TString *usertype;
  TString *local_38;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    var->k = VVOID;
    (var->u).info = 0;
    var->ravi_type_map = 0xffffffff;
    var->usertype = (TString *)0x0;
    var->pc = -1;
    (var->u).ind.usertype = (TString *)0x0;
  }
  else {
    uVar5 = (uint)fs->nactvar;
    do {
      if ((int)uVar5 < 1) {
        uVar5 = 0xffffffff;
        break;
      }
      uVar5 = uVar5 - 1;
      pLVar3 = getlocvar(fs,uVar5);
    } while (pLVar3->varname != n);
    if ((int)uVar5 < 0) {
      uVar5 = 0xffffffff;
      if ((ulong)fs->nups != 0) {
        pUVar6 = fs->f->upvalues;
        uVar4 = 0;
        do {
          if (pUVar6->name == n) {
            uVar5 = (uint)uVar4;
            break;
          }
          uVar4 = uVar4 + 1;
          pUVar6 = pUVar6 + 1;
        } while (fs->nups != uVar4);
      }
      if ((int)uVar5 < 0) {
        singlevaraux(fs->prev,n,var,0);
        if (var->k == VVOID) {
          return;
        }
        uVar5 = newupvalue(fs,n,var);
      }
      pUVar6 = fs->f->upvalues;
      rVar2 = pUVar6[uVar5].ravi_type_map;
      pTVar1 = pUVar6[uVar5].usertype;
      var->t = -1;
      var->f = -1;
      var->k = VUPVAL;
      (var->u).info = uVar5;
      var->ravi_type_map = rVar2;
      var->usertype = pTVar1;
      var->pc = -1;
      (var->u).ind.usertype = (TString *)0x0;
    }
    else {
      local_38 = (TString *)0x0;
      rVar2 = raviY_get_register_typeinfo(fs,uVar5,&local_38);
      var->t = -1;
      var->f = -1;
      var->k = VLOCAL;
      (var->u).info = uVar5;
      var->ravi_type_map = rVar2;
      var->usertype = local_38;
      var->pc = -1;
      (var->u).ind.usertype = (TString *)0x0;
      if (base == 0) {
        pBVar7 = (BlockCnt *)&fs->bl;
        do {
          pBVar7 = pBVar7->previous;
        } while ((int)uVar5 < (int)(uint)pBVar7->nactvar);
        pBVar7->upval = '\x01';
      }
    }
  }
  return;
}

Assistant:

static void singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL)  /* no more levels? */
    init_exp(var, VVOID, 0, RAVI_TM_ANY, NULL);  /* default is global */
  else {
    int v = searchvar(fs, n);  /* look up locals at current level */
    if (v >= 0) {  /* found? */
      /* RAVI set type of local var / expr if possible */
      TString *usertype = NULL;
      ravi_type_map tt = raviY_get_register_typeinfo(fs, v, &usertype);
      init_exp(var, VLOCAL, v, tt, usertype);  /* variable is local, RAVI set type */
      if (!base)
        markupval(fs, v);  /* local will be used as an upval */
    }
    else {  /* not found as local at current level; try upvalues */
      int idx = searchupvalue(fs, n);  /* try existing upvalues */
      if (idx < 0) {  /* not found? */
        singlevaraux(fs->prev, n, var, 0);  /* try upper levels */
        if (var->k == VVOID)  /* not found? */
          return;  /* it is a global */
        /* else was LOCAL or UPVAL */
        idx  = newupvalue(fs, n, var);  /* will be a new upvalue */
      }
      init_exp(var, VUPVAL, idx, fs->f->upvalues[idx].ravi_type_map, fs->f->upvalues[idx].usertype); /* RAVI : set upvalue type */
    }
  }
}